

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>
fmt::v8::detail::
write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned_long,char32_t>
          (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,unsigned_long value,
          uint prefix,basic_format_specs<char32_t> *specs,digit_grouping<char32_t> *grouping)

{
  int iVar1;
  int iVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> bVar3;
  anon_class_32_4_dca7119b local_a8;
  unsigned_long local_88;
  type local_7c;
  undefined1 auStack_78 [4];
  uint size;
  char local_68 [8];
  char digits [40];
  int num_digits;
  digit_grouping<char32_t> *grouping_local;
  basic_format_specs<char32_t> *specs_local;
  unsigned_long uStack_20;
  uint prefix_local;
  unsigned_long value_local;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out_local;
  
  specs_local._4_4_ = prefix;
  uStack_20 = value;
  value_local = (unsigned_long)out.container;
  digits._36_4_ = count_digits(value);
  _auStack_78 = format_decimal<char,unsigned_long>(local_68,uStack_20,digits._36_4_);
  iVar1 = (uint)(specs_local._4_4_ != 0) + digits._36_4_;
  iVar2 = digit_grouping<char32_t>::count_separators(grouping,digits._36_4_);
  local_7c = to_unsigned<int>(iVar1 + iVar2);
  local_88 = value_local;
  local_a8.prefix = (uint *)((long)&specs_local + 4);
  local_a8.digits = (char (*) [40])local_68;
  local_a8.num_digits = (int *)(digits + 0x24);
  local_a8.grouping = grouping;
  bVar3 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned_long,char32_t>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned_long,unsigned_int,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::digit_grouping<char32_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_>
                    ((back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)value_local,specs,
                     (ulong)local_7c,(ulong)local_7c,&local_a8);
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar3.container;
}

Assistant:

auto write_int_localized(OutputIt out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs,
                         const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = count_digits(value);
  char digits[40];
  format_decimal(digits, value, num_digits);
  unsigned size = to_unsigned((prefix != 0 ? 1 : 0) + num_digits +
                              grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        if (prefix != 0) *it++ = static_cast<Char>(prefix);
        return grouping.apply(it, string_view(digits, to_unsigned(num_digits)));
      });
}